

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImU32 ImGui::TabBarCalcTabID(ImGuiTabBar *tab_bar,char *label,ImGuiWindow *docked_window)

{
  ImGuiID id_00;
  char *in_RSI;
  char *in_RDI;
  ImGuiWindow *unaff_retaddr;
  ImGuiWindow *window;
  ImGuiID id;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((*(uint *)(in_RDI + 0x10) & 0x100000) == 0) {
    id_00 = ImGuiWindow::GetID(unaff_retaddr,
                               (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                               ,in_RDI);
  }
  else {
    id_00 = ImHashStr(in_RSI,0,0);
    KeepAliveID(id_00);
  }
  return id_00;
}

Assistant:

static ImU32   ImGui::TabBarCalcTabID(ImGuiTabBar* tab_bar, const char* label, ImGuiWindow* docked_window)
{
    IM_ASSERT(docked_window == NULL); // master branch only
    IM_UNUSED(docked_window);
    if (tab_bar->Flags & ImGuiTabBarFlags_DockNode)
    {
        ImGuiID id = ImHashStr(label);
        KeepAliveID(id);
        return id;
    }
    else
    {
        ImGuiWindow* window = GImGui->CurrentWindow;
        return window->GetID(label);
    }
}